

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(file + 0x38); lVar2 = lVar2 + 1) {
    ValidateProto3Field(this,(FieldDescriptor *)(*(long *)(file + 0x80) + lVar1),
                        (FieldDescriptorProto *)
                        ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    lVar1 = lVar1 + 0x98;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(file + 0x2c); lVar2 = lVar2 + 1) {
    ValidateProto3Message
              (this,(Descriptor *)(*(long *)(file + 0x68) + lVar1),
               (DescriptorProto *)
               ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    lVar1 = lVar1 + 0x90;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(file + 0x30); lVar2 = lVar2 + 1) {
    ValidateProto3Enum(this,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar1),
                       (EnumDescriptorProto *)
                       ((proto->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    lVar1 = lVar1 + 0x50;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3(FileDescriptor* file,
                                       const FileDescriptorProto& proto) {
  for (int i = 0; i < file->extension_count(); ++i) {
    ValidateProto3Field(file->extensions_ + i, proto.extension(i));
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    ValidateProto3Message(file->message_types_ + i, proto.message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); ++i) {
    ValidateProto3Enum(file->enum_types_ + i, proto.enum_type(i));
  }
}